

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.cpp
# Opt level: O0

void __thiscall gui::Gui::draw(Gui *this,RenderTarget *target,RenderStates states)

{
  bool bVar1;
  ContainerBase *in_RDI;
  shared_ptr<gui::Widget> *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *__range2;
  Color *in_stack_ffffffffffffffa8;
  RenderTexture *this_00;
  __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
  local_28;
  vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_> *local_20;
  Color local_14 [5];
  
  if (((ulong)in_RDI[0x14]._vptr_ContainerBase & 1) != 0) {
    this_00 = (RenderTexture *)
              &in_RDI[3].children_.
               super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    sf::Color::Color(local_14,'\0','\0','\0','\0');
    sf::RenderTarget::clear(&this_00->super_RenderTarget,in_stack_ffffffffffffffa8);
    local_20 = ContainerBase::getChildren(in_RDI);
    local_28._M_current =
         (shared_ptr<gui::Widget> *)
         std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::
         begin((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffffa8);
    std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>::end
              ((vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                *)in_stack_ffffffffffffffa8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                          *)this_00,
                         (__normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
                          *)in_stack_ffffffffffffffa8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator*(&local_28);
      in_stack_ffffffffffffffa8 =
           (Color *)&in_RDI[3].children_.
                     super__Vector_base<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
      std::__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<gui::Widget,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 this_00);
      sf::RenderTarget::draw
                ((RenderTarget *)states.transform.m_matrix._24_8_,
                 (Drawable *)states.transform.m_matrix._16_8_,
                 (RenderStates *)states.transform.m_matrix._8_8_);
      __gnu_cxx::
      __normal_iterator<const_std::shared_ptr<gui::Widget>_*,_std::vector<std::shared_ptr<gui::Widget>,_std::allocator<std::shared_ptr<gui::Widget>_>_>_>
      ::operator++(&local_28);
    }
    sf::RenderTexture::display(this_00);
    *(undefined1 *)&in_RDI[0x14]._vptr_ContainerBase = 0;
  }
  sf::RenderTarget::draw
            ((RenderTarget *)states.transform.m_matrix._24_8_,
             (Drawable *)states.transform.m_matrix._16_8_,
             (RenderStates *)states.transform.m_matrix._8_8_);
  return;
}

Assistant:

void Gui::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (redrawPending_) {
        GUI_DEBUG << "Gui redraw...\n";
        renderTexture_.clear({0, 0, 0, 0});
        for (const auto& child : getChildren()) {
            renderTexture_.draw(*child);
        }
        renderTexture_.display();
        redrawPending_ = false;
    }

    target.draw(renderSprite_, states);
}